

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

bool anon_unknown.dwarf_154c25e::operator==
               (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *l,JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *r)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = (l->Value)._M_string_length;
  if (__n == (r->Value)._M_string_length) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((l->Value)._M_dataplus._M_p,(r->Value)._M_dataplus._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return (bool)((l->Backtrace).Index == (r->Backtrace).Index & bVar2);
}

Assistant:

bool operator==(JBT<T> const& l, JBT<T> const& r)
  {
    return l.Value == r.Value && l.Backtrace.Index == r.Backtrace.Index;
  }